

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

const_reference __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::at(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
     *this,size_type idx)

{
  pointer pbVar1;
  type_error *__return_storage_ptr__;
  out_of_range *__return_storage_ptr___00;
  long *plVar2;
  size_type *psVar3;
  char *pcVar4;
  undefined1 auVar5 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if (this->m_type != array) {
    __return_storage_ptr__ = (type_error *)__cxa_allocate_exception(0x20);
    if ((ulong)this->m_type < 9) {
      pcVar4 = (&PTR_anon_var_dwarf_9da10_0051f660)[this->m_type];
    }
    else {
      pcVar4 = "number";
    }
    std::__cxx11::string::string((string *)&local_60,pcVar4,(allocator *)&local_40);
    std::operator+(&local_80,"cannot use at() with ",&local_60);
    detail::type_error::create(__return_storage_ptr__,0x130,&local_80);
    __cxa_throw(__return_storage_ptr__,&detail::type_error::typeinfo,detail::exception::~exception);
  }
  pbVar1 = (((this->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (idx < (ulong)((long)(((this->m_value).array)->
                          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 4)) {
    return pbVar1 + idx;
  }
  auVar5 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                      idx);
  if (auVar5._8_4_ == 1) {
    __cxa_begin_catch(auVar5._0_8_);
    __return_storage_ptr___00 = (out_of_range *)__cxa_allocate_exception(0x20);
    std::__cxx11::to_string(&local_40,idx);
    std::operator+(&local_60,"array index ",&local_40);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_80._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_80._M_dataplus._M_p == psVar3) {
      local_80.field_2._M_allocated_capacity = *psVar3;
      local_80.field_2._8_8_ = plVar2[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar3;
    }
    local_80._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    detail::out_of_range::create(__return_storage_ptr___00,0x191,&local_80);
    __cxa_throw(__return_storage_ptr___00,&detail::out_of_range::typeinfo,
                detail::exception::~exception);
  }
  _Unwind_Resume(auVar5._0_8_);
}

Assistant:

const_reference at(size_type idx) const {
		// at only works for arrays
		if (JSON_LIKELY(is_array())) {
			JSON_TRY { return m_value.array->at(idx); }
			JSON_CATCH(std::out_of_range&) {
				// create better exception explanation
				JSON_THROW(out_of_range::create(401, "array index " + std::to_string(idx) + " is out of range"));
			}
		}